

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O1

int cmphstr(char **p1,char *p2,bool allowParenthesisEnd)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  
  bVar4 = *p2;
  if (bVar4 == 0) {
    uVar6 = 0;
  }
  else {
    pcVar2 = *p1;
    uVar6 = 0;
    do {
      iVar3 = isalpha((uint)bVar4);
      if (iVar3 != 0) break;
      if (pcVar2[uVar6] != bVar4) goto LAB_0012366e;
      uVar6 = (ulong)((int)uVar6 + 1);
      bVar4 = p2[uVar6];
    } while (bVar4 != 0);
  }
  pcVar2 = *p1;
  iVar3 = isupper((uint)(byte)pcVar2[uVar6]);
  bVar4 = p2[uVar6];
  if (iVar3 == 0) {
    while (bVar4 != 0) {
      if (pcVar2[uVar6] != bVar4) goto LAB_0012366e;
      uVar6 = (ulong)((int)uVar6 + 1);
      bVar4 = p2[uVar6];
    }
  }
  else {
    while (bVar4 != 0) {
      cVar1 = pcVar2[uVar6];
      iVar3 = toupper((uint)bVar4);
      if (iVar3 != cVar1) goto LAB_0012366e;
      uVar6 = (ulong)((int)uVar6 + 1);
      bVar4 = p2[uVar6];
    }
  }
  bVar4 = pcVar2[uVar6];
  if ((bVar4 < 0x21) || (bVar4 == 0x3b)) {
LAB_00123683:
    *p1 = pcVar2 + uVar6;
    iVar3 = 1;
  }
  else {
    if (bVar4 == 0x2f) {
      uVar5 = (int)uVar6 + 1;
      if ((pcVar2[uVar5] == '/') || (pcVar2[uVar5] == '*')) goto LAB_00123683;
    }
    else if (allowParenthesisEnd && bVar4 == 0x28) goto LAB_00123683;
LAB_0012366e:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int cmphstr(char*& p1, const char* p2, bool allowParenthesisEnd) {
	unsigned int i = 0;
	// check initial non-alpha chars without deciding the upper/lower case of test
	while (p2[i] && !isalpha((byte)p2[i])) {
		if (p1[i] != p2[i]) return 0;
		++i;
	}
	// now the first alpha char will make whole test upper or lower case like.
	if (isupper((byte)p1[i])) {
		while (p2[i]) {
			if (p1[i] != toupper((byte)p2[i])) return 0;
			++i;
		}
	} else {
		while (p2[i]) {
			if (p1[i] != p2[i]) return 0;
			++i;
		}
	}
	if (p1[i]) {		// there is some character after the first word
		// whitespace, EOL-comment and block-comment-start keep the match valid
		// also starting parenthesis when allowParenthesisEnd
		if (
			!White(p1[i]) && \
			!(';' == p1[i]) && \
			!('/' == p1[i] && '/' == p1[i+1]) && \
			!('/' == p1[i] && '*' == p1[i+1]) && \
			!(allowParenthesisEnd && '(' == p1[i])
		) {
			return 0;	// anything else invalidates the found match
		}
	}
	// space, tab, enter, \0, ... => "match"
	p1 += i;
	return 1;
}